

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O0

uint8_t * MMFW_EntryData(MMFWEntry *entry)

{
  MMFWKind MVar1;
  MMFWEntry *entry_local;
  
  MVar1 = entry->kind;
  if (MVar1 == MMFW_KIND_SOUNDS) {
    entry_local = (MMFWEntry *)((entry->entry).sound)->data;
  }
  else if (MVar1 == MMFW_KIND_PICTURES) {
    entry_local = (MMFWEntry *)((entry->entry).picture)->data;
  }
  else if (MVar1 == MMFW_KIND_FILMS) {
    entry_local = (MMFWEntry *)((entry->entry).picture)->data;
  }
  else {
    entry_local = (MMFWEntry *)0x0;
  }
  return (uint8_t *)entry_local;
}

Assistant:

uint8_t *
MMFW_EntryData(const MMFWEntry *entry)
{
	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		return entry->entry.sound->data;
		break;
	case MMFW_KIND_PICTURES:
		return entry->entry.picture->data;
		break;
	case MMFW_KIND_FILMS:
		return entry->entry.film->data;
		break;
	default:
		return NULL; /* XXX NOTREACHED */
	}
}